

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

size_t fio_flush_all(void)

{
  ssize_t sVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (fio_data == (fio_data_s *)0x0) {
    sVar2 = 0;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 0x6f;
    lVar3 = 0;
    sVar2 = 0;
    do {
      if ((*(char *)((long)&(fio_data->last_cycle).tv_sec + lVar5) != '\0') ||
         (*(long *)((long)fio_data + lVar5 + -0x2f) != 0)) {
        sVar1 = fio_flush((ulong)*(byte *)((long)fio_data + lVar5 + -2) + lVar3);
        sVar2 = sVar2 + (0 < sVar1);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x100;
      lVar5 = lVar5 + 0xa8;
    } while (uVar4 < fio_data->max_protocol_fd);
  }
  return sVar2;
}

Assistant:

size_t fio_flush_all(void) {
  if (!fio_data)
    return 0;
  size_t count = 0;
  for (uintptr_t i = 0; i <= fio_data->max_protocol_fd; ++i) {
    if ((fd_data(i).open || fd_data(i).packet) && fio_flush(fd2uuid(i)) > 0)
      ++count;
  }
  return count;
}